

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  GLFWwindow *pGVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  undefined4 uVar10;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 auStack_58 [5];
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    uVar5 = 0;
    glfwWindowHint(0x20004,0);
    piVar9 = &titles_rel;
    while( true ) {
      pGVar4 = glfwCreateWindow(200,200,(char *)((long)&titles_rel + (long)*piVar9),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      auStack_58[uVar5] = pGVar4;
      if (pGVar4 == (GLFWwindow *)0x0) break;
      glfwSetKeyCallback(pGVar4,key_callback);
      glfwMakeContextCurrent(pGVar4);
      uVar10 = 0x3f800000;
      if (uVar5 != 0) {
        uVar10 = 0;
      }
      uVar8 = (uint)uVar5 & 1;
      uVar7 = (uint)(uVar5 >> 1) & 0x7fffffff;
      glClearColor((float)uVar8,(float)uVar7,uVar10,0);
      glfwGetWindowFrameSize(pGVar4,&local_5c,&local_60,&local_64,&local_68);
      glfwSetWindowPos(pGVar4,(local_5c + local_64 + 200) * uVar8 + 100,
                       (local_60 + local_68 + 200) * uVar7 + 100);
      uVar5 = uVar5 + 1;
      piVar9 = piVar9 + 1;
      if (uVar5 == 4) {
        lVar6 = 0;
        do {
          glfwShowWindow((GLFWwindow *)auStack_58[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        lVar6 = 0;
        bVar2 = true;
        do {
          do {
            bVar1 = bVar2;
            pGVar4 = (GLFWwindow *)auStack_58[lVar6];
            glfwMakeContextCurrent(pGVar4);
            glClear(0x4000);
            glfwSwapBuffers(pGVar4);
            iVar3 = glfwWindowShouldClose(pGVar4);
            if (iVar3 != 0) {
              bVar1 = false;
            }
            lVar6 = lVar6 + 1;
            bVar2 = bVar1;
          } while (lVar6 != 4);
          glfwPollEvents();
          lVar6 = 0;
          bVar2 = true;
        } while (bVar1);
        glfwTerminate();
        exit(0);
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    int i;
    GLboolean running = GL_TRUE;
    GLFWwindow* windows[4];

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        glClearColor((GLclampf) (i & 1),
                     (GLclampf) (i >> 1),
                     i ? 0.f : 1.f,
                     0.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GL_FALSE;
        }

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}